

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
          (RepeatedImmutableMessageFieldGenerator *this,Printer *printer,char *method_prototype,
          char *regular_case,char *nested_builder_case,char *trailing_code,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  char *pcVar1;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  RepeatedImmutableMessageFieldGenerator *local_78;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  char *local_40;
  char *trailing_code_local;
  char *nested_builder_case_local;
  char *regular_case_local;
  char *method_prototype_local;
  Printer *printer_local;
  RepeatedImmutableMessageFieldGenerator *this_local;
  optional<google::protobuf::io::AnnotationCollector::Semantic> semantic_local;
  
  this_local = (RepeatedImmutableMessageFieldGenerator *)
               semantic.
               super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
               ._M_payload.
               super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>;
  local_40 = trailing_code;
  trailing_code_local = nested_builder_case;
  nested_builder_case_local = regular_case;
  regular_case_local = method_prototype;
  method_prototype_local = (char *)printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,method_prototype);
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutableMessageFieldGenerator).variables_,local_50);
  pcVar1 = method_prototype_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"}");
  local_78 = this_local;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)pcVar1,local_60,local_70,
             (this->super_ImmutableMessageFieldGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)this_local);
  pcVar1 = method_prototype_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88," {\n");
  protobuf::io::Printer::Print<>((Printer *)pcVar1,local_88);
  protobuf::io::Printer::Indent((Printer *)method_prototype_local);
  (*(this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.super_FieldGenerator.
    _vptr_FieldGenerator[0x15])
            (this,method_prototype_local,nested_builder_case_local,trailing_code_local);
  pcVar1 = method_prototype_local;
  if (local_40 != (char *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,local_40);
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)pcVar1,&(this->super_ImmutableMessageFieldGenerator).variables_,local_98);
  }
  protobuf::io::Printer::Outdent((Printer *)method_prototype_local);
  pcVar1 = method_prototype_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}\n");
  protobuf::io::Printer::Print<>((Printer *)pcVar1,local_a8);
  return;
}

Assistant:

void RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction(
    io::Printer* printer, const char* method_prototype,
    const char* regular_case, const char* nested_builder_case,
    const char* trailing_code,
    absl::optional<io::AnnotationCollector::Semantic> semantic) const {
  printer->Print(variables_, method_prototype);
  printer->Annotate("{", "}", descriptor_, semantic);
  printer->Print(" {\n");
  printer->Indent();
  PrintNestedBuilderCondition(printer, regular_case, nested_builder_case);
  if (trailing_code != nullptr) {
    printer->Print(variables_, trailing_code);
  }
  printer->Outdent();
  printer->Print("}\n");
}